

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O2

void __thiscall
CDoodadsMapper::PlaceDoodads
          (CDoodadsMapper *this,CLayerTiles *pLayer,CRule *pRule,
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          *pPositions,int Amount,int LeftWall)

{
  int *piVar1;
  uchar *puVar2;
  int iVar3;
  CTile CVar4;
  CTile *pCVar5;
  int iVar6;
  bool bVar7;
  int y_1;
  uint uVar8;
  array<int,_allocator_default<int>_> *paVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int Value;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  EVP_PKEY_CTX *pEVar23;
  char cVar24;
  int y;
  long lVar25;
  int iVar26;
  long in_FS_OFFSET;
  long lStack_90;
  array<int,_allocator_default<int>_> local_58;
  array<int,_allocator_default<int>_> local_48;
  long local_38;
  EVP_PKEY_CTX *ctx;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pRule->m_Location == 1) {
    lStack_90 = 0x14;
  }
  else {
    if (pRule->m_Location != 2) goto LAB_00182938;
    lStack_90 = 0x10;
  }
  piVar1 = (int *)((long)&(pRule->m_Rect).field_0 + lStack_90);
  *piVar1 = *piVar1 + 1;
LAB_00182938:
  if (LeftWall != 0) {
    pRule->m_HFlip = pRule->m_HFlip ^ LeftWall;
    (pRule->m_RelativePos).field_0.x =
         2 - ((pRule->m_RelativePos).field_0.x + (pRule->m_Size).field_0.x);
  }
  iVar26 = pLayer->m_Height * pLayer->m_Width;
  iVar17 = pRule->m_Random;
  iVar10 = (int)(((101.0 - (float)Amount) / 100.0) * (float)iVar17);
  if (iVar17 == 1) {
    iVar10 = 1;
  }
  Value = 2;
  if (2 < iVar10) {
    Value = iVar10;
  }
  if (iVar17 < 2) {
    Value = iVar10;
  }
  lVar15 = 0;
  do {
    if (pPositions->num_elements <= lVar15) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    uVar19 = 0;
    while( true ) {
      paVar9 = pPositions->list;
      iVar17 = (int)uVar19;
      if (paVar9[lVar15].num_elements <= iVar17) break;
      if ((uint)pRule->m_Location < 2) {
        iVar10 = (pRule->m_Size).field_0.x;
joined_r0x001829f6:
        if (paVar9[lVar15].num_elements - iVar17 < iVar10) break;
      }
      else if (pRule->m_Location == 2) {
        iVar10 = (pRule->m_Size).field_1.y;
        goto joined_r0x001829f6;
      }
      if (Value < 2) {
LAB_00182a1b:
        iVar10 = paVar9[lVar15].list[iVar17];
        iVar12 = (pRule->m_RelativePos).field_0.x;
        uVar8 = pLayer->m_Width;
        iVar20 = (pRule->m_RelativePos).field_1.y * uVar8;
        uVar18 = iVar12 + iVar20 + iVar10;
        ctx = (EVP_PKEY_CTX *)(ulong)uVar18;
        cVar24 = '\0';
        pEVar23 = ctx;
        for (lVar25 = 0; uVar13 = (ulong)(pRule->m_Size).field_1.y, lVar25 < (long)uVar13;
            lVar25 = lVar25 + 1) {
          for (lVar14 = 0; lVar14 < (pRule->m_Size).field_0.x; lVar14 = lVar14 + 1) {
            iVar21 = (int)(pEVar23 + lVar14);
            if (iVar21 < iVar26 && 0 < iVar21) {
              pLayer->m_pTiles[(ulong)(pEVar23 + lVar14) & 0xffffffff].m_Index =
                   cVar24 + (char)lVar14 + (char)(pRule->m_Rect).field_0.x;
            }
          }
          cVar24 = cVar24 + '\x10';
          pEVar23 = pEVar23 + uVar8;
        }
        if (pRule->m_HFlip != 0) {
          for (iVar21 = 0; iVar21 < (int)uVar13; iVar21 = iVar21 + 1) {
            iVar22 = 0;
            iVar6 = iVar20 + iVar10 + iVar12;
            while( true ) {
              iVar6 = iVar6 + -1;
              iVar3 = (pRule->m_Size).field_0.x;
              if (iVar3 / 2 <= iVar22) break;
              iVar16 = pLayer->m_Width * iVar21;
              uVar8 = uVar18 + iVar22 + iVar16;
              if (((int)uVar8 < iVar26 && 0 < (int)uVar8) &&
                 (uVar11 = iVar3 + iVar6 + iVar16, (int)uVar11 < iVar26 && 0 < (int)uVar11)) {
                pCVar5 = pLayer->m_pTiles;
                CVar4 = pCVar5[uVar8];
                pCVar5[uVar8] = pCVar5[uVar11];
                pLayer->m_pTiles[uVar11] = CVar4;
              }
              iVar22 = iVar22 + 1;
            }
            uVar13 = (ulong)(uint)(pRule->m_Size).field_1.y;
          }
          for (iVar10 = 0; iVar10 < (int)uVar13; iVar10 = iVar10 + 1) {
            for (iVar12 = 0; iVar12 < (pRule->m_Size).field_0.x; iVar12 = iVar12 + 1) {
              uVar8 = pLayer->m_Width * iVar10 + uVar18 + iVar12;
              if ((int)uVar8 < iVar26 && 0 < (int)uVar8) {
                puVar2 = &pLayer->m_pTiles[uVar8].m_Flags;
                *puVar2 = *puVar2 ^ 1;
              }
            }
            uVar13 = (ulong)(uint)(pRule->m_Size).field_1.y;
          }
        }
        if (pRule->m_VFlip != 0) {
          iVar10 = -1;
          for (iVar12 = 0;
              iVar12 < (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff
                                   ) / 2); iVar12 = iVar12 + 1) {
            pEVar23 = ctx;
            for (iVar20 = 0; iVar20 < (pRule->m_Size).field_0.x; iVar20 = iVar20 + 1) {
              iVar21 = (int)pEVar23;
              uVar8 = iVar12 * pLayer->m_Width + iVar21;
              if (((int)uVar8 < iVar26 && 0 < (int)uVar8) &&
                 (uVar11 = pLayer->m_Width * ((pRule->m_Size).field_1.y + iVar10) + iVar21,
                 (int)uVar11 < iVar26 && 0 < (int)uVar11)) {
                pCVar5 = pLayer->m_pTiles;
                CVar4 = pCVar5[uVar8];
                pCVar5[uVar8] = pCVar5[uVar11];
                pLayer->m_pTiles[uVar11] = CVar4;
              }
              pEVar23 = (EVP_PKEY_CTX *)(ulong)(iVar21 + 1);
            }
            uVar13 = (ulong)(uint)(pRule->m_Size).field_1.y;
            iVar10 = iVar10 + -1;
          }
          for (iVar10 = 0; iVar10 < (int)uVar13; iVar10 = iVar10 + 1) {
            for (iVar12 = 0; iVar12 < (pRule->m_Size).field_0.x; iVar12 = iVar12 + 1) {
              uVar8 = pLayer->m_Width * iVar10 + uVar18 + iVar12;
              if ((int)uVar8 < iVar26 && 0 < (int)uVar8) {
                puVar2 = &pLayer->m_pTiles[uVar8].m_Flags;
                *puVar2 = *puVar2 ^ 2;
              }
            }
            uVar13 = (ulong)(uint)(pRule->m_Size).field_1.y;
          }
        }
        if (1 < Value) {
          array<int,_allocator_default<int>_>::init(&local_48,ctx);
          array<int,_allocator_default<int>_>::init(&local_58,ctx);
          uVar13 = 0;
          if (0 < iVar17) {
            uVar13 = uVar19;
          }
          for (lVar25 = 0; uVar13 * 4 != lVar25; lVar25 = lVar25 + 4) {
            array<int,_allocator_default<int>_>::add
                      (&local_48,(int *)((long)pPositions->list[lVar15].list + lVar25));
          }
          lVar14 = (long)(iVar17 + (&(pRule->m_Size).field_0)[pRule->m_Location == 2].x);
          lVar25 = lVar14 * 4;
          for (; lVar14 < pPositions->list[lVar15].num_elements; lVar14 = lVar14 + 1) {
            array<int,_allocator_default<int>_>::add
                      (&local_58,(int *)((long)pPositions->list[lVar15].list + lVar25));
            lVar25 = lVar25 + 4;
          }
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          ::remove_index(pPositions,(int)lVar15);
          if (1 < local_48.num_elements) {
            array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::add(pPositions,&local_48);
          }
          if (1 < local_58.num_elements) {
            array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::add(pPositions,&local_58);
          }
          allocator_default<int>::free_array(local_58.list);
          allocator_default<int>::free_array(local_48.list);
          iVar17 = -1;
        }
      }
      else {
        bVar7 = IAutoMapper::Random(Value);
        if (bVar7) {
          paVar9 = pPositions->list;
          goto LAB_00182a1b;
        }
      }
      uVar19 = (ulong)(uint)(iVar17 + (pRule->m_Size).field_0.x);
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

void CDoodadsMapper::PlaceDoodads(CLayerTiles *pLayer, CRule *pRule, array<array<int> > *pPositions, int Amount, int LeftWall)
{
	if(pRule->m_Location == CRule::CEILING)
		pRule->m_RelativePos.y++;
	else if(pRule->m_Location == CRule::WALLS)
		pRule->m_RelativePos.x++;

	// left walls
	if(LeftWall)
	{
		pRule->m_HFlip ^= LeftWall;
		pRule->m_RelativePos.x--;
		pRule->m_RelativePos.x = -pRule->m_RelativePos.x;
		pRule->m_RelativePos.x -= pRule->m_Size.x-1;
	}

	int MaxIndex = pLayer->m_Width*pLayer->m_Height;
	int RandomValue = pRule->m_Random*((101.f-Amount)/100.0f);

	if(pRule->m_Random == 1)
		RandomValue = 1;

	// allow diversity with high Amount
	if(pRule->m_Random > 1 && RandomValue <= 1)
		RandomValue = 2;

	for(int f = 0; f < pPositions->size(); f++)
		for(int c = 0; c < (*pPositions)[f].size(); c += pRule->m_Size.x)
		{
			if((pRule->m_Location == CRule::FLOOR || pRule->m_Location == CRule::CEILING)
				&& (*pPositions)[f].size()-c < pRule->m_Size.x)
			break;

			if(pRule->m_Location == CRule::WALLS && (*pPositions)[f].size()-c < pRule->m_Size.y)
				break;

			if(RandomValue > 1 && !IAutoMapper::Random(RandomValue))
				continue;

			// where to put it
			int ID = (*pPositions)[f][c];

			// relative position
			ID += pRule->m_RelativePos.x;
			ID += pRule->m_RelativePos.y*pLayer->m_Width;

			for(int y = 0; y < pRule->m_Size.y; y++)
				for(int x = 0; x < pRule->m_Size.x; x++)
				{
					int Index = y*pLayer->m_Width+x+ID;
					if(Index <= 0 || Index >= MaxIndex)
						continue;

					pLayer->m_pTiles[Index].m_Index = pRule->m_Rect.x+y*16+x;
				}

			// hflip
			if(pRule->m_HFlip)
			{
				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x/2; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						int CheckIndex = Index+pRule->m_Size.x-1-x*2;

						if(CheckIndex <= 0 || CheckIndex >= MaxIndex)
							continue;

						CTile Tmp = pLayer->m_pTiles[Index];
						pLayer->m_pTiles[Index] = pLayer->m_pTiles[CheckIndex];
						pLayer->m_pTiles[CheckIndex] = Tmp;
					}

				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						pLayer->m_pTiles[Index].m_Flags ^= TILEFLAG_VFLIP;
					}
			}

			// vflip
			if(pRule->m_VFlip)
			{
				for(int y = 0; y < pRule->m_Size.y/2; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						int CheckIndex = Index+(pRule->m_Size.y-1-y*2)*pLayer->m_Width;

						if(CheckIndex <= 0 || CheckIndex >= MaxIndex)
							continue;

						CTile Tmp = pLayer->m_pTiles[Index];
						pLayer->m_pTiles[Index] = pLayer->m_pTiles[CheckIndex];
						pLayer->m_pTiles[CheckIndex] = Tmp;
					}

				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						pLayer->m_pTiles[Index].m_Flags ^= TILEFLAG_HFLIP;
					}
			}

			// make the place occupied
			if(RandomValue > 1)
			{
				array<int> aChainBefore;
				array<int> aChainAfter;

				for(int j = 0; j < c; j++)
					aChainBefore.add((*pPositions)[f][j]);

				int Size = pRule->m_Size.x;
				if(pRule->m_Location == CRule::WALLS)
					Size = pRule->m_Size.y;

				for(int j = c+Size; j < (*pPositions)[f].size(); j++)
					aChainAfter.add((*pPositions)[f][j]);

				pPositions->remove_index(f);

				// f changes, reset c
				c = -1;

				if(aChainBefore.size() > 1)
					pPositions->add(aChainBefore);
				if(aChainAfter.size() > 1)
					pPositions->add(aChainAfter);
			}
		}
}